

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_type_handler.h
# Opt level: O2

size_t google::protobuf::internal::
       MapEntryFuncs<int,_proto2_unittest::TestRequiredLite,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
       ::ByteSizeLong(int *key,TestRequiredLite *value)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  
  iVar2 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)5,_int>::ByteSize
                    (key);
  sVar4 = WireFormatLite::MessageSize<proto2_unittest::TestRequiredLite>(value);
  uVar3 = (int)sVar4 + iVar2 + 2U | 1;
  iVar1 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  return (ulong)(iVar1 * 9 + 0x49U >> 6) + (long)iVar2 + sVar4 + 2;
}

Assistant:

static size_t ByteSizeLong(const Key& key, const Value& value) {
    // Tags for key and value will both be one byte (field numbers 1 and 2).
    size_t inner_length =
        2 + KeyTypeHandler::ByteSize(key) + ValueTypeHandler::ByteSize(value);
    return inner_length + io::CodedOutputStream::VarintSize32(
                              static_cast<uint32_t>(inner_length));
  }